

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O2

void __thiscall
symbol_table_visitor::assert_type(symbol_table_visitor *this,Type *checking,Type *needed)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  char *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = std::operator!=(checking->name,needed->name);
  if ((!bVar1) && (checking->is_array == needed->is_array)) {
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(&local_48,"syntax error: got ",checking->name);
  __rhs_00 = "";
  __rhs = "";
  if (checking->is_array != false) {
    __rhs = "[]";
  }
  std::operator+(&local_68,&local_48,__rhs);
  std::operator+(&local_88,&local_68,", ");
  std::operator+(&local_a8,&local_88,needed->name);
  if (needed->is_array != false) {
    __rhs_00 = "[]";
  }
  std::operator+(&local_c8,&local_a8,__rhs_00);
  std::operator+(__return_storage_ptr__,&local_c8," expected");
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void symbol_table_visitor::assert_type(const Type* checking, const Type* needed) {
    if (*checking->name != *needed->name || checking->is_array != needed->is_array) {
        throw "syntax error: got " + *checking->name + (checking->is_array ? "[]" : "") + 
            ", " + *needed->name + (needed->is_array ? "[]" : "") + " expected";
    }
}